

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_83682d::Marshal<MLKEM768_public_key>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          _func_int_CBB_ptr_MLKEM768_public_key_ptr *marshal_func,MLKEM768_public_key *t)

{
  int iVar1;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  uint8_t *encoded;
  size_t encoded_len;
  ScopedCBB cbb;
  allocator_type local_59;
  uchar *local_58;
  size_t local_50;
  CBB local_48;
  
  CBB_zero(&local_48);
  iVar1 = CBB_init(&local_48,1);
  if (iVar1 != 0) {
    iVar1 = MLKEM768_marshal_public_key(&local_48,(MLKEM768_public_key *)marshal_func);
    if (iVar1 != 0) {
      iVar1 = CBB_finish(&local_48,&local_58,&local_50);
      if (iVar1 != 0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   local_58,local_58 + local_50,&local_59);
        OPENSSL_free(local_58);
        CBB_cleanup(&local_48);
        return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(extraout_var,extraout_EAX);
      }
    }
  }
  abort();
}

Assistant:

std::vector<uint8_t> Marshal(int (*marshal_func)(CBB *, const T *),
                             const T *t) {
  bssl::ScopedCBB cbb;
  uint8_t *encoded;
  size_t encoded_len;
  if (!CBB_init(cbb.get(), 1) ||      //
      !marshal_func(cbb.get(), t) ||  //
      !CBB_finish(cbb.get(), &encoded, &encoded_len)) {
    abort();
  }

  std::vector<uint8_t> ret(encoded, encoded + encoded_len);
  OPENSSL_free(encoded);
  return ret;
}